

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irq.c
# Opt level: O3

void gen_irq(void)

{
  int iVar1;
  bool bVar2;
  
  getkey();
  if (intd_f == '\0') {
    iVar1 = gen_irq::type_counter + 1;
    bVar2 = gen_irq::type_counter == 2;
    if ((uint)gen_irq::type_counter < 2) {
      if ((s_via[0xe] & 0x40) != 0) {
        s_via[0xd] = s_via[0xd] | 0xc0;
        gen_irq::type_counter = iVar1;
        irq();
        return;
      }
      s_via[0xd] = s_via[0xd] | 0x40;
      gen_irq::type_counter = iVar1;
    }
    else {
      gen_irq::type_counter = iVar1;
      if (bVar2) {
        if ((s_via[0xe] & 2) == 0) {
          s_via[0xd] = s_via[0xd] | 2;
        }
        else {
          s_via[0xd] = s_via[0xd] | 0x82;
          irq();
        }
        gen_irq::type_counter = 0;
      }
    }
  }
  return;
}

Assistant:

void gen_irq(void) {        // Main interrupt generation and handler routine
    // static type_counter=0; // Added to support c99
    static int type_counter = 0;

    getkey();               // Check for key input and convert pc
    // keypress to BBC internal keynumber

    if (!intd_f)            // if interrupts are enabled
    {
        type_counter++;      // step through different interrupt types
        switch (type_counter) {
            case 1:
            case 2:
                if (s_via[IER] & 0x40) {
                    s_via[IFR] |= 0xC0;
                    irq();
                }
                else s_via[IFR] |= 0x40;
                break;                  // 100 Hz interrupt

            case 3:
                if (s_via[IER] & 0x02) {
                    s_via[IFR] |= 0x82;
                    irq();
                }
                else s_via[IFR] |= 0x02;
                type_counter = 0;         // 50 Hz vertical blank interrupt
                break;
        }
    }
}